

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int mbedtls_ssl_fetch_input(mbedtls_ssl_context *ssl,size_t nb_want)

{
  uint uVar1;
  uchar *puVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  mbedtls_ssl_context *pmVar6;
  size_t __n;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  
  if ((ssl->f_recv == (mbedtls_ssl_recv_t *)0x0) &&
     (ssl->f_recv_timeout == (mbedtls_ssl_recv_timeout_t *)0x0)) {
    return -0x7100;
  }
  puVar2 = ssl->in_hdr;
  if (ssl->in_buf + (0x414d - (long)puVar2) < nb_want) {
    return -0x7100;
  }
  if ((ssl->conf->field_0x174 & 2) == 0) {
    uVar10 = ssl->in_left;
    do {
      if (nb_want <= uVar10) {
        return 0;
      }
      uVar10 = nb_want - uVar10;
      if (ssl->f_get_timer == (mbedtls_ssl_get_timer_t *)0x0) {
LAB_001192c5:
        if (ssl->f_recv_timeout == (mbedtls_ssl_recv_timeout_t *)0x0) {
          uVar4 = (*ssl->f_recv)(ssl->p_bio,ssl->in_hdr + ssl->in_left,uVar10);
        }
        else {
          uVar4 = (*ssl->f_recv_timeout)
                            (ssl->p_bio,ssl->in_hdr + ssl->in_left,uVar10,ssl->conf->read_timeout);
        }
        uVar7 = (ulong)uVar4;
      }
      else {
        iVar3 = (*ssl->f_get_timer)(ssl->p_timer);
        uVar7 = 0xffff9800;
        if (iVar3 != 2) goto LAB_001192c5;
      }
      iVar3 = (int)uVar7;
      if (iVar3 == 0) {
        return -0x7280;
      }
      if (iVar3 < 0) {
        return iVar3;
      }
      if (uVar10 < uVar7) {
        return -0x6c00;
      }
      uVar10 = uVar7 + ssl->in_left;
      ssl->in_left = uVar10;
    } while( true );
  }
  iVar3 = -0x7100;
  if ((ssl->f_set_timer != (mbedtls_ssl_set_timer_t *)0x0) &&
     (ssl->f_get_timer != (mbedtls_ssl_get_timer_t *)0x0)) {
    uVar10 = ssl->next_record_offset;
    if (uVar10 == 0) {
LAB_0011937e:
      iVar3 = 0;
      bVar11 = false;
      if (nb_want <= ssl->in_left) goto LAB_0011939d;
      if (ssl->in_left != 0) goto LAB_00119396;
      if (ssl->f_get_timer == (mbedtls_ssl_get_timer_t *)0x0) {
LAB_001193e4:
        puVar2 = ssl->in_hdr;
        if (ssl->f_recv_timeout == (mbedtls_ssl_recv_timeout_t *)0x0) {
          uVar4 = (*ssl->f_recv)(ssl->p_bio,puVar2,(size_t)(ssl->in_buf + (0x414d - (long)puVar2)));
        }
        else {
          bVar11 = ssl->state == 0x10;
          pmVar6 = (mbedtls_ssl_context *)&ssl->handshake;
          if (bVar11) {
            pmVar6 = ssl;
          }
          lVar9 = 0x3d0;
          if (bVar11) {
            lVar9 = 0x150;
          }
          uVar4 = (*ssl->f_recv_timeout)
                            (ssl->p_bio,puVar2,(size_t)(ssl->in_buf + (0x414d - (long)puVar2)),
                             *(uint32_t *)((long)pmVar6->conf->ciphersuite_list + lVar9));
        }
        uVar10 = (ulong)uVar4;
        if (uVar4 == 0) {
          iVar3 = -0x7280;
          goto LAB_0011939b;
        }
      }
      else {
        iVar3 = (*ssl->f_get_timer)(ssl->p_timer);
        uVar10 = 0xffff9800;
        if (iVar3 != 2) goto LAB_001193e4;
      }
      iVar3 = (int)uVar10;
      if (iVar3 == -0x6800) {
        if (ssl->f_set_timer != (mbedtls_ssl_set_timer_t *)0x0) {
          (*ssl->f_set_timer)(ssl->p_timer,0,0);
        }
        if (ssl->state == 0x10) {
          if (((ssl->conf->field_0x174 & 1) == 0) || (ssl->renego_status != 3)) goto LAB_0011947c;
          iVar5 = ssl_resend_hello_request(ssl);
        }
        else {
          uVar4 = ssl->handshake->retransmit_timeout;
          uVar1 = ssl->conf->hs_timeout_max;
          if (uVar1 <= uVar4) {
            iVar3 = -0x6800;
            goto LAB_0011939b;
          }
          uVar8 = uVar4 * 2;
          if (uVar1 <= uVar4 * 2) {
            uVar8 = uVar1;
          }
          if ((int)uVar4 < 0) {
            uVar8 = uVar1;
          }
          ssl->handshake->retransmit_timeout = uVar8;
          iVar5 = mbedtls_ssl_resend(ssl);
        }
        iVar3 = -0x6900;
        if (iVar5 != 0) {
          iVar3 = iVar5;
        }
      }
      else {
LAB_0011947c:
        if (-1 < iVar3) {
          ssl->in_left = uVar10;
          bVar11 = true;
          goto LAB_0011939d;
        }
      }
    }
    else {
      __n = ssl->in_left - uVar10;
      if (uVar10 <= ssl->in_left) {
        ssl->in_left = __n;
        if (__n != 0) {
          memmove(puVar2,puVar2 + uVar10,__n);
        }
        ssl->next_record_offset = 0;
        goto LAB_0011937e;
      }
LAB_00119396:
      iVar3 = -0x6c00;
    }
  }
LAB_0011939b:
  bVar11 = false;
LAB_0011939d:
  if (bVar11) {
    return 0;
  }
  return iVar3;
}

Assistant:

int mbedtls_ssl_fetch_input( mbedtls_ssl_context *ssl, size_t nb_want )
{
    int ret;
    size_t len;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> fetch input" ) );

    if( ssl->f_recv == NULL && ssl->f_recv_timeout == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "Bad usage of mbedtls_ssl_set_bio() "
                            "or mbedtls_ssl_set_bio()" ) );
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
    }

    if( nb_want > MBEDTLS_SSL_BUFFER_LEN - (size_t)( ssl->in_hdr - ssl->in_buf ) )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "requesting more data than fits" ) );
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
    }

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
    {
        uint32_t timeout;

        /* Just to be sure */
        if( ssl->f_set_timer == NULL || ssl->f_get_timer == NULL )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "You must use "
                        "mbedtls_ssl_set_timer_cb() for DTLS" ) );
            return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
        }

        /*
         * The point is, we need to always read a full datagram at once, so we
         * sometimes read more then requested, and handle the additional data.
         * It could be the rest of the current record (while fetching the
         * header) and/or some other records in the same datagram.
         */

        /*
         * Move to the next record in the already read datagram if applicable
         */
        if( ssl->next_record_offset != 0 )
        {
            if( ssl->in_left < ssl->next_record_offset )
            {
                MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
                return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
            }

            ssl->in_left -= ssl->next_record_offset;

            if( ssl->in_left != 0 )
            {
                MBEDTLS_SSL_DEBUG_MSG( 2, ( "next record in same datagram, offset: %d",
                                    ssl->next_record_offset ) );
                memmove( ssl->in_hdr,
                         ssl->in_hdr + ssl->next_record_offset,
                         ssl->in_left );
            }

            ssl->next_record_offset = 0;
        }

        MBEDTLS_SSL_DEBUG_MSG( 2, ( "in_left: %d, nb_want: %d",
                       ssl->in_left, nb_want ) );

        /*
         * Done if we already have enough data.
         */
        if( nb_want <= ssl->in_left)
        {
            MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= fetch input" ) );
            return( 0 );
        }

        /*
         * A record can't be split accross datagrams. If we need to read but
         * are not at the beginning of a new record, the caller did something
         * wrong.
         */
        if( ssl->in_left != 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
            return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
        }

        /*
         * Don't even try to read if time's out already.
         * This avoids by-passing the timer when repeatedly receiving messages
         * that will end up being dropped.
         */
        if( ssl_check_timer( ssl ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 2, ( "timer has expired" ) );
            ret = MBEDTLS_ERR_SSL_TIMEOUT;
        }
        else
        {
            len = MBEDTLS_SSL_BUFFER_LEN - ( ssl->in_hdr - ssl->in_buf );

            if( ssl->state != MBEDTLS_SSL_HANDSHAKE_OVER )
                timeout = ssl->handshake->retransmit_timeout;
            else
                timeout = ssl->conf->read_timeout;

            MBEDTLS_SSL_DEBUG_MSG( 3, ( "f_recv_timeout: %u ms", timeout ) );

            if( ssl->f_recv_timeout != NULL )
                ret = ssl->f_recv_timeout( ssl->p_bio, ssl->in_hdr, len,
                                                                    timeout );
            else
                ret = ssl->f_recv( ssl->p_bio, ssl->in_hdr, len );

            MBEDTLS_SSL_DEBUG_RET( 2, "ssl->f_recv(_timeout)", ret );

            if( ret == 0 )
                return( MBEDTLS_ERR_SSL_CONN_EOF );
        }

        if( ret == MBEDTLS_ERR_SSL_TIMEOUT )
        {
            MBEDTLS_SSL_DEBUG_MSG( 2, ( "timeout" ) );
            ssl_set_timer( ssl, 0 );

            if( ssl->state != MBEDTLS_SSL_HANDSHAKE_OVER )
            {
                if( ssl_double_retransmit_timeout( ssl ) != 0 )
                {
                    MBEDTLS_SSL_DEBUG_MSG( 1, ( "handshake timeout" ) );
                    return( MBEDTLS_ERR_SSL_TIMEOUT );
                }

                if( ( ret = mbedtls_ssl_resend( ssl ) ) != 0 )
                {
                    MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_resend", ret );
                    return( ret );
                }

                return( MBEDTLS_ERR_SSL_WANT_READ );
            }
#if defined(MBEDTLS_SSL_SRV_C) && defined(MBEDTLS_SSL_RENEGOTIATION)
            else if( ssl->conf->endpoint == MBEDTLS_SSL_IS_SERVER &&
                     ssl->renego_status == MBEDTLS_SSL_RENEGOTIATION_PENDING )
            {
                if( ( ret = ssl_resend_hello_request( ssl ) ) != 0 )
                {
                    MBEDTLS_SSL_DEBUG_RET( 1, "ssl_resend_hello_request", ret );
                    return( ret );
                }

                return( MBEDTLS_ERR_SSL_WANT_READ );
            }
#endif /* MBEDTLS_SSL_SRV_C && MBEDTLS_SSL_RENEGOTIATION */
        }

        if( ret < 0 )
            return( ret );

        ssl->in_left = ret;
    }
    else
#endif
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "in_left: %d, nb_want: %d",
                       ssl->in_left, nb_want ) );

        while( ssl->in_left < nb_want )
        {
            len = nb_want - ssl->in_left;

            if( ssl_check_timer( ssl ) != 0 )
                ret = MBEDTLS_ERR_SSL_TIMEOUT;
            else
            {
                if( ssl->f_recv_timeout != NULL )
                {
                    ret = ssl->f_recv_timeout( ssl->p_bio,
                                               ssl->in_hdr + ssl->in_left, len,
                                               ssl->conf->read_timeout );
                }
                else
                {
                    ret = ssl->f_recv( ssl->p_bio,
                                       ssl->in_hdr + ssl->in_left, len );
                }
            }

            MBEDTLS_SSL_DEBUG_MSG( 2, ( "in_left: %d, nb_want: %d",
                                        ssl->in_left, nb_want ) );
            MBEDTLS_SSL_DEBUG_RET( 2, "ssl->f_recv(_timeout)", ret );

            if( ret == 0 )
                return( MBEDTLS_ERR_SSL_CONN_EOF );

            if( ret < 0 )
                return( ret );

            if ( (size_t)ret > len || ( INT_MAX > SIZE_MAX && ret > SIZE_MAX ) )
            {
                MBEDTLS_SSL_DEBUG_MSG( 1,
                    ( "f_recv returned %d bytes but only %lu were requested",
                    ret, (unsigned long)len ) );
                return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
            }

            ssl->in_left += ret;
        }
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= fetch input" ) );

    return( 0 );
}